

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O2

int duckdb_hll::sdscmp(sds s1,sds s2)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  size_t __n;
  
  sVar2 = sdslen(s1);
  sVar3 = sdslen(s2);
  __n = sVar2;
  if (sVar3 <= sVar2) {
    __n = sVar3;
  }
  iVar4 = 1;
  if (sVar2 <= sVar3) {
    iVar4 = -(uint)(sVar2 < sVar3);
  }
  iVar1 = switchD_015d2190::default(s1,s2,__n);
  if (iVar1 == 0) {
    iVar1 = iVar4;
  }
  return iVar1;
}

Assistant:

int sdscmp(const sds s1, const sds s2) {
    size_t l1, l2, minlen;
    int cmp;

    l1 = sdslen(s1);
    l2 = sdslen(s2);
    minlen = (l1 < l2) ? l1 : l2;
    cmp = memcmp(s1,s2,minlen);
    if (cmp == 0) return l1>l2? 1: (l1<l2? -1: 0);
    return cmp;
}